

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

void __thiscall Clasp::Asp::PrgBody::~PrgBody(PrgBody *this)

{
  clearHeads(this);
  if ((*(uint *)&this->field_0x8 & 0x18000000) == 0x8000000) {
    operator_delete((void *)this[1].super_PrgNode);
    return;
  }
  return;
}

Assistant:

PrgBody::~PrgBody() {
	clearHeads();
	if (hasWeights()) {
		sumData()->destroy();
	}
}